

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GPUShaderFP64Test3::iterate(GPUShaderFP64Test3 *this)

{
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestContext *pTVar2;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  GPUShaderFP64Test3 *pGStack_10;
  bool result;
  GPUShaderFP64Test3 *this_local;
  
  local_11 = 1;
  pGStack_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_gpu_shader_fp64 is not supported",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  testInit(this);
  bVar1 = test(this,PACKED);
  if (!bVar1) {
    local_11 = 0;
  }
  bVar1 = test(this,SHARED);
  if (!bVar1) {
    local_11 = 0;
  }
  bVar1 = test(this,STD140);
  if (!bVar1) {
    local_11 = 0;
  }
  if ((local_11 & 1) == 1) {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test3::iterate()
{
	bool result = true;

	/* Check if extension is supported */
	if (false == m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported");
	}

	/* Initialize test */
	testInit();

	/* Test "packed" uniform buffer layout */
	if (false == test(PACKED))
	{
		result = false;
	}

	/* Test "shared" uniform buffer layout */
	if (false == test(SHARED))
	{
		result = false;
	}

	/* Test "std140" uniform buffer layout */
	if (false == test(STD140))
	{
		result = false;
	}

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}